

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O0

void __thiscall OpenMD::DataHolder::assign<double>(DataHolder *this,string *keyword,double val)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  ostream *poVar4;
  OpenMDException *this_00;
  string *msg;
  undefined8 uVar5;
  string *in_RSI;
  undefined8 in_XMM0_Qa;
  stringstream ss_1;
  stringstream ss;
  bool result;
  iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd8;
  key_type *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  OpenMDException *in_stack_fffffffffffffbf0;
  stringstream local_3a8 [16];
  ostream local_398 [376];
  _Self local_220;
  _Self local_218;
  undefined1 local_209;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [383];
  byte local_29;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  string *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
               *)in_stack_fffffffffffffbd8,(key_type *)0x24d21e);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
              *)in_stack_fffffffffffffbd8);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                           *)0x24d267);
    uVar2 = (*ppVar3->second->_vptr_ParameterBase[6])(local_18);
    local_29 = (byte)uVar2 & 1;
    if ((uVar2 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar4 = std::operator<<(local_1a8,"Error in parsing ");
      poVar4 = std::operator<<(poVar4,local_10);
      poVar4 = std::operator<<(poVar4,": expected ");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                             *)0x24d2f7);
      (*ppVar3->second->_vptr_ParameterBase[9])(local_1e8);
      poVar4 = std::operator<<(poVar4,local_1e8);
      poVar4 = std::operator<<(poVar4," but got ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,&local_18);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_1e8);
      local_209 = 1;
      this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(this_00,in_stack_fffffffffffffbe8);
      local_209 = 0;
      __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
  }
  else {
    local_218._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    local_220._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffbd8);
    bVar1 = std::operator!=(&local_218,&local_220);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_3a8);
      msg = (string *)std::operator<<(local_398,local_10);
      std::operator<<((ostream *)msg," is not a recognized keyword.\n");
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(in_stack_fffffffffffffbf0,msg);
      __cxa_throw(uVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    uVar5 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",uVar5);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
  }
  return;
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }